

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

bool __thiscall capnp::_::ListReader::isCanonical(ListReader *this,word **readHead,WirePointer *ref)

{
  ElementSize EVar1;
  uint64_t *puVar2;
  bool bVar3;
  word *pwVar4;
  uint uVar5;
  word *pwVar6;
  byte bVar7;
  long lVar8;
  ulong uVar9;
  Iterator __begin3;
  ElementCount index;
  byte bVar10;
  uint ec_1;
  bool ptrTrunc;
  bool dataTrunc;
  word *pointerHead;
  word *local_80;
  Iterator __end3;
  word *listEnd;
  Fault f;
  
  EVar1 = this->elementSize;
  if (EVar1 == POINTER) {
    if ((word *)this->ptr == *readHead) {
      uVar5 = this->elementCount;
      *readHead = *readHead + uVar5;
      uVar9 = 0;
      do {
        bVar7 = uVar5 == uVar9;
        if ((bool)bVar7) break;
        f.exception = (Exception *)this->segment;
        bVar3 = PointerReader::isCanonical((PointerReader *)&f,readHead);
        uVar9 = uVar9 + 1;
      } while (bVar3);
      goto LAB_0028ce12;
    }
  }
  else if (EVar1 == INLINE_COMPOSITE) {
    pwVar4 = *readHead + 1;
    *readHead = pwVar4;
    if (((word *)this->ptr == pwVar4) && ((this->structDataSize & 0x3f) == 0)) {
      uVar5 = (this->structDataSize >> 6 & 0xffff) + (uint)this->structPointerCount;
      ___end3 = (ulong)this->elementCount;
      lVar8 = uVar5 * ___end3;
      if (lVar8 - (ulong)((ref->field_1).upper32Bits >> 3) == 0) {
        if (uVar5 == 0) {
LAB_0028ce77:
          bVar7 = 1;
        }
        else {
          pointerHead = pwVar4 + lVar8;
          bVar10 = 0;
          bVar7 = 0;
          local_80 = pointerHead;
          listEnd = pointerHead;
          for (index = 0; __end3.value != index; index = index + 1) {
            getStructElement((StructReader *)&f,this,index);
            bVar3 = StructReader::isCanonical
                              ((StructReader *)&f,readHead,&pointerHead,&dataTrunc,&ptrTrunc);
            if (!bVar3) goto LAB_0028ce10;
            bVar7 = bVar7 | dataTrunc;
            bVar10 = bVar10 | ptrTrunc;
          }
          if (*readHead != local_80) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,capnp::word_const*&,capnp::word_const*&>
                      (&f,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                       ,0xca3,FAILED,"*readHead == listEnd","*readHead, listEnd",readHead,&listEnd);
            kj::_::Debug::Fault::fatal(&f);
          }
          *readHead = pointerHead;
          bVar7 = bVar7 & bVar10;
        }
        goto LAB_0028ce12;
      }
    }
  }
  else {
    pwVar4 = *readHead;
    if ((word *)this->ptr == pwVar4) {
      uVar9 = (ulong)*(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)EVar1 * 4) *
              (ulong)this->elementCount;
      pwVar6 = (word *)((long)&pwVar4->content + (uVar9 >> 3));
      if ((uVar9 & 7) != 0) {
        if ((byte)((byte)pwVar6->content >> (sbyte)(uVar9 & 7)) != 0) goto LAB_0028ce10;
        pwVar6 = (word *)((long)&pwVar6->content + 1);
      }
      do {
        if (pwVar6 == pwVar4 + (uVar9 + 0x3f >> 6)) {
          *readHead = pwVar4 + (uVar9 + 0x3f >> 6);
          goto LAB_0028ce77;
        }
        puVar2 = &pwVar6->content;
        pwVar6 = (word *)((long)&pwVar6->content + 1);
      } while ((char)*puVar2 == '\0');
    }
  }
LAB_0028ce10:
  bVar7 = 0;
LAB_0028ce12:
  return (bool)(bVar7 & 1);
}

Assistant:

bool ListReader::isCanonical(const word **readHead, const WirePointer *ref) {
  switch (this->getElementSize()) {
    case ElementSize::INLINE_COMPOSITE: {
      *readHead += 1;
      if (reinterpret_cast<const word*>(this->ptr) != *readHead) {
        // The next word to read is the tag word, but the pointer is in
        // front of it, so our check is slightly different
        return false;
      }
      if (this->structDataSize % BITS_PER_WORD != ZERO * BITS) {
        return false;
      }
      auto elementSize = StructSize(this->structDataSize / BITS_PER_WORD,
                                    this->structPointerCount).total() / ELEMENTS;
      auto totalSize = upgradeBound<uint64_t>(this->elementCount) * elementSize;
      if (totalSize != ref->listRef.inlineCompositeWordCount()) {
        return false;
      }
      if (elementSize == ZERO * WORDS / ELEMENTS) {
        return true;
      }
      auto listEnd = *readHead + totalSize;
      auto pointerHead = listEnd;
      bool listDataTrunc = false;
      bool listPtrTrunc = false;
      for (auto ec: kj::zeroTo(this->elementCount)) {
        bool dataTrunc, ptrTrunc;
        if (!this->getStructElement(ec).isCanonical(readHead,
                                                    &pointerHead,
                                                    &dataTrunc,
                                                    &ptrTrunc)) {
          return false;
        }
        listDataTrunc |= dataTrunc;
        listPtrTrunc  |= ptrTrunc;
      }
      KJ_REQUIRE(*readHead == listEnd, *readHead, listEnd);
      *readHead = pointerHead;
      return listDataTrunc && listPtrTrunc;
    }
    case ElementSize::POINTER: {
      if (reinterpret_cast<const word*>(this->ptr) != *readHead) {
        return false;
      }
      *readHead += this->elementCount * (POINTERS / ELEMENTS) * WORDS_PER_POINTER;
      for (auto ec: kj::zeroTo(this->elementCount)) {
        if (!this->getPointerElement(ec).isCanonical(readHead)) {
          return false;
        }
      }
      return true;
    }
    default: {
      if (reinterpret_cast<const word*>(this->ptr) != *readHead) {
        return false;
      }

      auto bitSize = upgradeBound<uint64_t>(this->elementCount) *
                     dataBitsPerElement(this->elementSize);
      auto truncatedByteSize = bitSize / BITS_PER_BYTE;
      auto byteReadHead = reinterpret_cast<const uint8_t*>(*readHead) + truncatedByteSize;
      auto readHeadEnd = *readHead + WireHelpers::roundBitsUpToWords(bitSize);

      auto leftoverBits = bitSize % BITS_PER_BYTE;
      if (leftoverBits > ZERO * BITS) {
        auto mask = ~((1 << unbound(leftoverBits / BITS)) - 1);

        if (mask & *byteReadHead) {
          return false;
        }
        byteReadHead += 1;
      }

      while (byteReadHead != reinterpret_cast<const uint8_t*>(readHeadEnd)) {
        if (*byteReadHead != 0) {
          return false;
        }
        byteReadHead += 1;
      }

      *readHead = readHeadEnd;
      return true;
    }
  }
  KJ_UNREACHABLE;
}